

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QPluginParsedMetaData>::emplace<QPluginParsedMetaData_const&>
          (QGenericArrayOps<QPluginParsedMetaData> *this,qsizetype i,QPluginParsedMetaData *args)

{
  qsizetype *pqVar1;
  QPluginParsedMetaData **ppQVar2;
  Data *pDVar3;
  long lVar4;
  QPluginParsedMetaData *pQVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  Inserter local_88;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QPluginParsedMetaData>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_002dd7dc:
    local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QCborValue::QCborValue((QCborValue *)local_38,&args->data);
    bVar8 = (this->super_QArrayDataPointer<QPluginParsedMetaData>).size != 0;
    QArrayDataPointer<QPluginParsedMetaData>::detachAndGrow
              (&this->super_QArrayDataPointer<QPluginParsedMetaData>,(uint)(i == 0 && bVar8),1,
               (QPluginParsedMetaData **)0x0,(QArrayDataPointer<QPluginParsedMetaData> *)0x0);
    uVar6 = local_38._8_8_;
    if (i == 0 && bVar8) {
      pQVar5 = (this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr;
      pQVar5[-1].data.n = local_38._0_8_;
      local_38._8_8_ = (QCborContainerPrivate *)0x0;
      pQVar5[-1].data.container = (QCborContainerPrivate *)uVar6;
      uVar7 = local_38._16_4_;
      local_38._16_4_ = 0x117;
      pQVar5[-1].data.t = uVar7;
      (this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr = pQVar5 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<QPluginParsedMetaData>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_88.sourceCopyConstruct = 0;
      local_88.nSource = 0;
      local_88.move = 0;
      local_88.sourceCopyAssign = 0;
      local_88.end = (QPluginParsedMetaData *)0x0;
      local_88.last = (QPluginParsedMetaData *)0x0;
      local_88.where = (QPluginParsedMetaData *)0x0;
      local_88.begin = (this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr;
      local_88.size = (this->super_QArrayDataPointer<QPluginParsedMetaData>).size;
      local_88.data = &this->super_QArrayDataPointer<QPluginParsedMetaData>;
      Inserter::insertOne(&local_88,i,(QPluginParsedMetaData *)local_38);
      (local_88.data)->ptr = local_88.begin;
      (local_88.data)->size = local_88.size;
    }
    QCborValue::~QCborValue((QCborValue *)local_38);
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QPluginParsedMetaData>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      QCborValue::QCborValue
                ((QCborValue *)((this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr + lVar4),
                 &args->data);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QPluginParsedMetaData *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr)) goto LAB_002dd7dc;
      QCborValue::QCborValue
                ((QCborValue *)((this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr + -1),
                 &args->data);
      ppQVar2 = &(this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr;
      *ppQVar2 = *ppQVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<QPluginParsedMetaData>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }